

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_scanner.hpp
# Opt level: O3

void __thiscall MC::MC_Scanner::MC_Scanner(MC_Scanner *this,istream *in)

{
  location_type *plVar1;
  
  yyFlexLexer::yyFlexLexer(&this->super_yyFlexLexer,in,(ostream *)0x0);
  (this->super_yyFlexLexer).super_FlexLexer._vptr_FlexLexer =
       (_func_int **)&PTR__yyFlexLexer_0015d2f8;
  this->yylval = (semantic_type *)0x0;
  this->loc = (location_type *)0x0;
  plVar1 = (location_type *)operator_new(0x20);
  (plVar1->begin).filename = (filename_type *)0x0;
  (plVar1->begin).line = 1;
  (plVar1->begin).column = 1;
  (plVar1->end).filename = (filename_type *)0x0;
  (plVar1->end).line = 1;
  (plVar1->end).column = 1;
  this->loc = plVar1;
  return;
}

Assistant:

MC_Scanner(std::istream *in) : yyFlexLexer(in)
   {
      loc = new MC::MC_Parser::location_type();
   }